

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

char * __thiscall
cmLocalGenerator::GetFeature(cmLocalGenerator *this,string *feature,string *config)

{
  ulong uVar1;
  cmLocalGenerator *pcVar2;
  cmLocalGenerator *parent;
  char *value_1;
  char *value;
  undefined1 local_48 [8];
  string featureConfig;
  string *config_local;
  string *feature_local;
  cmLocalGenerator *this_local;
  
  featureConfig.field_2._8_8_ = config;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)local_48,(string *)feature);
    std::__cxx11::string::operator+=((string *)local_48,"_");
    cmsys::SystemTools::UpperCase((string *)&value,(string *)featureConfig.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_48,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    pcVar2 = (cmLocalGenerator *)cmMakefile::GetProperty(this->Makefile,(string *)local_48);
    if (pcVar2 != (cmLocalGenerator *)0x0) {
      this_local = pcVar2;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (pcVar2 != (cmLocalGenerator *)0x0) {
      return (char *)this_local;
    }
  }
  this_local = (cmLocalGenerator *)cmMakefile::GetProperty(this->Makefile,feature);
  if (this_local == (cmLocalGenerator *)0x0) {
    pcVar2 = GetParent(this);
    if (pcVar2 == (cmLocalGenerator *)0x0) {
      this_local = (cmLocalGenerator *)0x0;
    }
    else {
      this_local = (cmLocalGenerator *)
                   GetFeature(pcVar2,feature,(string *)featureConfig.field_2._8_8_);
    }
  }
  return (char *)this_local;
}

Assistant:

const char* cmLocalGenerator::GetFeature(const std::string& feature,
                                         const std::string& config)
{
  // TODO: Define accumulation policy for features (prepend, append, replace).
  // Currently we always replace.
  if(!config.empty())
    {
    std::string featureConfig = feature;
    featureConfig += "_";
    featureConfig += cmSystemTools::UpperCase(config);
    if(const char* value = this->Makefile->GetProperty(featureConfig))
      {
      return value;
      }
    }
  if(const char* value = this->Makefile->GetProperty(feature))
    {
    return value;
    }
  if(cmLocalGenerator* parent = this->GetParent())
    {
    return parent->GetFeature(feature, config);
    }
  return 0;
}